

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram-cache.cpp
# Opt level: O2

llama_token
try_draft(common_ngram_cache *nc_primary,
         vector<common_ngram,_std::allocator<common_ngram>_> *ngrams_primary,
         common_ngram_cache_part *part_static,int *min_sample_size,int *min_percent)

{
  pointer pcVar1;
  int iVar2;
  iterator iVar3;
  iterator iVar4;
  int iVar5;
  __node_base *p_Var6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  llama_token token;
  int *local_b0;
  int *local_a8;
  _Hashtable<common_ngram,_std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<common_ngram>,_common_ngram_hash_function,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_a0;
  vector<common_ngram,_std::allocator<common_ngram>_> *local_98;
  ulong local_90;
  ulong local_88;
  _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_80;
  common_ngram ngram_primary;
  common_ngram_cache_part part_primary;
  
  iVar7 = -1;
  uVar11 = (ulong)((long)(ngrams_primary->
                         super__Vector_base<common_ngram,_std::allocator<common_ngram>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(ngrams_primary->
                        super__Vector_base<common_ngram,_std::allocator<common_ngram>_>)._M_impl.
                        super__Vector_impl_data._M_start) >> 4 & 0xffffffff;
  local_b0 = min_percent;
  local_a8 = min_sample_size;
  local_a0 = &nc_primary->_M_h;
  local_98 = ngrams_primary;
  local_80 = &part_static->_M_h;
  while( true ) {
    uVar11 = uVar11 - 1;
    if (((int)(uint)uVar11 < 0) || (iVar7 != -1)) break;
    uVar8 = (ulong)((uint)uVar11 & 0x7fffffff);
    pcVar1 = (local_98->super__Vector_base<common_ngram,_std::allocator<common_ngram>_>)._M_impl.
             super__Vector_impl_data._M_start + uVar8;
    ngram_primary.tokens._0_8_ = *(undefined8 *)pcVar1->tokens;
    ngram_primary.tokens._8_8_ = *(undefined8 *)(pcVar1->tokens + 2);
    iVar3 = std::
            _Hashtable<common_ngram,_std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<common_ngram>,_common_ngram_hash_function,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(local_a0,&ngram_primary);
    iVar7 = -1;
    if (iVar3.
        super__Node_iterator_base<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_true>
        ._M_cur != (__node_type *)0x0) {
      local_90 = uVar8;
      local_88 = uVar11;
      std::
      _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::_Hashtable(&part_primary._M_h,
                   (_Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)((long)iVar3.
                             super__Node_iterator_base<std::pair<const_common_ngram,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_true>
                             ._M_cur + 0x18));
      iVar9 = 0;
      p_Var6 = &part_primary._M_h._M_before_begin;
      iVar10 = -1;
      iVar7 = 0;
      iVar12 = 0;
      while (p_Var6 = p_Var6->_M_nxt, p_Var6 != (__node_base *)0x0) {
        token = (llama_token)*(size_type *)(p_Var6 + 1);
        iVar2 = *(int *)((long)(p_Var6 + 1) + 4);
        iVar4 = std::
                _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(local_80,&token);
        iVar5 = 1;
        if (iVar4.super__Node_iterator_base<std::pair<const_int,_int>,_false>._M_cur !=
            (__node_type *)0x0) {
          iVar5 = *(int *)((long)iVar4.super__Node_iterator_base<std::pair<const_int,_int>,_false>.
                                 _M_cur + 0xc) * 100;
        }
        if (iVar12 * iVar7 < iVar5 * iVar2) {
          iVar12 = iVar2;
          iVar7 = iVar5;
          iVar10 = token;
        }
        iVar9 = iVar9 + iVar2;
      }
      iVar7 = -1;
      if ((local_a8[local_90] <= iVar9) &&
         (iVar7 = iVar10, iVar12 * 100 < iVar9 * local_b0[local_90])) {
        iVar7 = -1;
      }
      std::
      _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&part_primary._M_h);
      uVar11 = local_88;
    }
  }
  return iVar7;
}

Assistant:

static llama_token try_draft(
    common_ngram_cache & nc_primary, const std::vector<common_ngram> & ngrams_primary, common_ngram_cache_part & part_static,
    const int * min_sample_size, const int * min_percent) {

    llama_token drafted_token = LLAMA_TOKEN_NULL;

    for (int i = ngrams_primary.size()-1; i >= 0 && drafted_token == LLAMA_TOKEN_NULL; --i) {
        const common_ngram ngram_primary = ngrams_primary[i];

        common_ngram_cache::iterator part_primary_it = nc_primary.find(ngram_primary);
        if (part_primary_it == nc_primary.end()) {
            continue;
        }
        const common_ngram_cache_part part_primary = part_primary_it->second;

        int max_count_primary = 0;
        int max_count_static  = 0;
        int sum_count_primary = 0;
        llama_token max_token = LLAMA_TOKEN_NULL;

        for (std::pair<llama_token, int> token_count_primary : part_primary) {
            const llama_token token = token_count_primary.first;

            common_ngram_cache_part::iterator token_count_static_it = part_static.find(token);

            const int32_t count_primary = token_count_primary.second;
            const int32_t count_static  = token_count_static_it != part_static.end() ? 100*token_count_static_it->second : 1;

            if (count_primary*count_static > max_count_primary*max_count_static) {
                max_token         = token;
                max_count_primary = count_primary;
                max_count_static  = count_static;
            }
            sum_count_primary += count_primary;
        }

        if (sum_count_primary < min_sample_size[i]) {
            continue;
        }
        if (100*max_count_primary < min_percent[i]*sum_count_primary) {
            continue;;
        }
        drafted_token = max_token;
    }

    return drafted_token;
}